

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_open(Curl_easy **curl)

{
  Curl_easy *data_00;
  Curl_easy *data;
  CURLcode result;
  Curl_easy **curl_local;
  
  data_00 = (Curl_easy *)(*Curl_ccalloc)(1,0x14e0);
  if (data_00 == (Curl_easy *)0x0) {
    curl_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    data_00->magic = 0xc0dedbad;
    Curl_dyn_init(&(data_00->state).headerb,0x19000);
    Curl_req_init(&data_00->req);
    Curl_initinfo(data_00);
    Curl_llist_init(&(data_00->state).httphdrs,(Curl_llist_dtor)0x0);
    Curl_netrc_init(&(data_00->state).netrc);
    data._4_4_ = Curl_resolver_init(data_00,&(data_00->state).async.resolver);
    if ((data._4_4_ == CURLE_OK) &&
       (data._4_4_ = Curl_init_userdefined(data_00), data._4_4_ == CURLE_OK)) {
      (data_00->state).lastconnect_id = -1;
      (data_00->state).recent_conn_id = -1;
      data_00->id = -1;
      data_00->mid = -1;
      (data_00->set).dohfor_mid = -1;
      (data_00->progress).flags = (data_00->progress).flags | 0x10;
      (data_00->state).current_speed = -1;
    }
    if (data._4_4_ == CURLE_OK) {
      *curl = data_00;
    }
    else {
      Curl_resolver_cleanup((data_00->state).async.resolver);
      Curl_dyn_free(&(data_00->state).headerb);
      Curl_freeset(data_00);
      Curl_req_free(&data_00->req,data_00);
      (*Curl_cfree)(data_00);
    }
    curl_local._4_4_ = data._4_4_;
  }
  return curl_local._4_4_;
}

Assistant:

CURLcode Curl_open(struct Curl_easy **curl)
{
  CURLcode result;
  struct Curl_easy *data;

  /* simple start-up: alloc the struct, init it with zeroes and return */
  data = calloc(1, sizeof(struct Curl_easy));
  if(!data) {
    /* this is a serious error */
    DEBUGF(fprintf(stderr, "Error: calloc of Curl_easy failed\n"));
    return CURLE_OUT_OF_MEMORY;
  }

  data->magic = CURLEASY_MAGIC_NUMBER;

  Curl_dyn_init(&data->state.headerb, CURL_MAX_HTTP_HEADER);
  Curl_req_init(&data->req);
  Curl_initinfo(data);
#ifndef CURL_DISABLE_HTTP
  Curl_llist_init(&data->state.httphdrs, NULL);
#endif
  Curl_netrc_init(&data->state.netrc);

  result = Curl_resolver_init(data, &data->state.async.resolver);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: resolver_init failed\n"));
    goto out;
  }

  result = Curl_init_userdefined(data);
  if(result)
    goto out;

  /* most recent connection is not yet defined */
  data->state.lastconnect_id = -1;
  data->state.recent_conn_id = -1;
  /* and not assigned an id yet */
  data->id = -1;
  data->mid = -1;
#ifndef CURL_DISABLE_DOH
  data->set.dohfor_mid = -1;
#endif

  data->progress.flags |= PGRS_HIDE;
  data->state.current_speed = -1; /* init to negative == impossible */

out:
  if(result) {
    Curl_resolver_cleanup(data->state.async.resolver);
    Curl_dyn_free(&data->state.headerb);
    Curl_freeset(data);
    Curl_req_free(&data->req, data);
    free(data);
    data = NULL;
  }
  else
    *curl = data;
  return result;
}